

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::ReservoirSample::Vacuum(ReservoirSample *this)

{
  idx_t iVar1;
  pointer pRVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> local_20;
  __uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_> local_18;
  
  if (this->stats_sample == false) {
    iVar1 = GetActiveSampleCount(this);
    uVar3 = this->sample_count;
    uVar4 = 0x800;
    if (uVar3 < 0x800) {
      uVar4 = uVar3;
    }
    lVar5 = uVar4 * 10 + uVar3;
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.8;
    uVar3 = (ulong)dVar7;
    if (iVar1 <= ((long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3))
    goto LAB_01a26d57;
  }
  iVar1 = NumSamplesCollected(this);
  if (iVar1 < 0x801) {
    return;
  }
  if ((this->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0)
  {
    return;
  }
  if ((this->super_BlockingSample).destroyed != false) {
    return;
  }
LAB_01a26d57:
  (*(this->super_BlockingSample)._vptr_BlockingSample[3])(&local_18,this);
  local_20._M_head_impl =
       (ReservoirSample *)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl =
       (tuple<duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>)
       (_Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>)
       0x0;
  pRVar2 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_20);
  ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
  operator=((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *
            )&this->reservoir_chunk,
            (__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *
            )&pRVar2->reservoir_chunk);
  pRVar2 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_20);
  SelectionVector::operator=(&this->sel,&pRVar2->sel);
  pRVar2 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_20);
  this->sel_size = pRVar2->sel_size;
  if (local_20._M_head_impl != (ReservoirSample *)0x0) {
    (*((local_20._M_head_impl)->super_BlockingSample)._vptr_BlockingSample[1])();
  }
  if (local_18._M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
      .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>)
      0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
                          .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl + 8)
    )();
  }
  return;
}

Assistant:

void ReservoirSample::Vacuum() {
	Verify();
	bool do_vacuum = false;
	// when it's not a stats sample, sometimes we neverr collect more than FIXED_SAMPLE_SIZE tuples
	// but we still need to vacuum, so the rules are a little bit different.
	if (!stats_sample && GetActiveSampleCount() <= static_cast<idx_t>(GetReservoirChunkCapacity<double>() * 0.8)) {
		do_vacuum = true;
	}
	if (!do_vacuum && (NumSamplesCollected() <= FIXED_SAMPLE_SIZE || !reservoir_chunk || destroyed)) {
		// sample is destroyed or too small to shrink
		// sample does not need to be vacuumed.
		return;
	}

	auto ret = Copy();
	auto ret_reservoir = duckdb::unique_ptr_cast<BlockingSample, ReservoirSample>(std::move(ret));
	reservoir_chunk = std::move(ret_reservoir->reservoir_chunk);
	sel = std::move(ret_reservoir->sel);
	sel_size = ret_reservoir->sel_size;

	Verify();
	// We should only have one sample chunk now.
	D_ASSERT(Chunk().size() > 0 && Chunk().size() <= sample_count);
}